

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.h
# Opt level: O2

void format::read_string(ifstream *in_file,string *context,string *indent)

{
  int iVar1;
  string *s;
  undefined1 auVar2 [16];
  string line;
  char *local_50;
  undefined8 local_48;
  char local_40 [16];
  
  local_50 = local_40;
  local_48 = 0;
  local_40[0] = '\0';
  do {
    while( true ) {
      if (((byte)in_file[*(long *)(*(long *)in_file + -0x18) + 0x20] & 2) != 0) goto LAB_0013b3ad;
      auVar2 = std::istream::tellg();
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)in_file,(string *)&local_50);
      s = (string *)0x0;
      iVar1 = std::__cxx11::string::compare((ulong)&local_50,0,(string *)indent->_M_string_length);
      if (iVar1 != 0) break;
      ltrim((format *)&local_50,s);
      std::__cxx11::string::append((char *)&local_50);
      std::__cxx11::string::append((string *)context);
    }
  } while (*local_50 == '-');
  std::istream::seekg(in_file,auVar2._0_8_,auVar2._8_8_);
LAB_0013b3ad:
  std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

void read_string(std::ifstream &in_file, std::string &context, std::string indent = "  "){
  std::string line;
  while (!in_file.eof()){
   std::streampos oldpos = in_file.tellg();  // stores the position
   std::getline(in_file,line);
   if(line.compare(0, indent.size(), indent)){
    if(line[0] == '-') //TODO not sure if this is always true
     continue;
    in_file.seekg (oldpos);   // get back to the position
    break;
   } else{
    ltrim(line);
    line+="\n";
    context.append(line);
   }
  }
 }